

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

bool is_modifier(Token *token)

{
  Kind KVar1;
  Token *token_local;
  
  KVar1 = token->kind;
  if (((KVar1 - PUBLIC < 3) || (KVar1 == STATIC)) || (KVar1 == FINAL)) {
    token_local._4_4_ = 1;
  }
  else {
    token_local._4_4_ = 0;
  }
  return token_local._4_4_;
}

Assistant:

bool is_modifier(Token *token) {
    switch (g_kind(token)) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case STATIC:
        case FINAL:
            return true;
        default:
            return false;
    }
}